

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

void __thiscall
SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::
read_chunked_transfer_encoded
          (ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
          *session,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf)

{
  __uniq_ptr_data<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_true,_true>
  this_00;
  type *in_R9;
  string_view delim;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  
  Connection::set_timeout
            ((((session->
               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->connection).
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0);
  local_40 = (session->
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  local_20 = (local_40->response).
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  this_00.
  super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  .super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>.
  _M_head_impl = (((local_40->connection).
                   super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->socket)._M_t.
                 super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  ;
  local_38 = (session->
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  local_30 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  local_28 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  delim._M_str = (char *)&local_48;
  delim._M_len = (size_t)"\r\n";
  local_48 = this;
  asio::
  async_read_until<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::read_chunked_transfer_encoded(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Session>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            ((asio *)this_00.
                     super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                     .
                     super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>
                     ._M_head_impl,
             (stream<asio::basic_stream_socket<asio::ip::tcp>_> *)&stack0xffffffffffffffe0,
             (basic_streambuf_ref<std::allocator<char>_> *)0x2,delim,in_R9);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void read_chunked_transfer_encoded(const std::shared_ptr<Session> &session, const std::shared_ptr<asio::streambuf> &chunks_streambuf) {
      session->connection->set_timeout();
      asio::async_read_until(*session->connection->socket, session->response->streambuf, "\r\n", [this, session, chunks_streambuf](const error_code &ec, size_t bytes_transferred) {
        session->connection->cancel_timeout();
        auto lock = session->connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if((!ec || ec == asio::error::not_found) && session->response->streambuf.size() == session->response->streambuf.max_size()) {
          session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
          return;
        }
        if(!ec) {
          std::string line;
          getline(session->response->content, line);
          bytes_transferred -= line.size() + 1;
          line.pop_back();
          unsigned long length = 0;
          try {
            length = stoul(line, 0, 16);
          }
          catch(...) {
            session->callback(session->connection, make_error_code::make_error_code(errc::protocol_error));
            return;
          }

          auto num_additional_bytes = session->response->streambuf.size() - bytes_transferred;

          if((2 + length) > num_additional_bytes) {
            session->connection->set_timeout();
            asio::async_read(*session->connection->socket, session->response->streambuf, asio::transfer_exactly(2 + length - num_additional_bytes), [this, session, chunks_streambuf, length](const error_code &ec, size_t /*bytes_transferred*/) {
              session->connection->cancel_timeout();
              auto lock = session->connection->handler_runner->continue_lock();
              if(!lock)
                return;
              if(!ec) {
                if(session->response->streambuf.size() == session->response->streambuf.max_size()) {
                  session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
                  return;
                }
                this->read_chunked_transfer_encoded_chunk(session, chunks_streambuf, length);
              }
              else
                session->callback(session->connection, ec);
            });
          }
          else
            this->read_chunked_transfer_encoded_chunk(session, chunks_streambuf, length);
        }
        else
          session->callback(session->connection, ec);
      });
    }